

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BrokerBase.cpp
# Opt level: O1

void __thiscall helics::BrokerBase::queueProcessingLoop(BrokerBase *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  BlockingPriorityQueue<helics::ActionMessage,_std::mutex,_std::condition_variable> *this_00;
  GlobalFederateId GVar2;
  _func_int *owner;
  pointer pcVar3;
  char *pcVar4;
  size_type sVar5;
  string_view message;
  string_view message_00;
  undefined8 uVar6;
  action_t aVar7;
  uint uVar8;
  int iVar9;
  int iVar10;
  long lVar11;
  long lVar12;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar13;
  int *piVar14;
  long lVar15;
  ActionMessage *command_00;
  ActionMessage *command_01;
  ulong uVar16;
  undefined8 uVar17;
  bool bVar18;
  string_view name;
  string_view name_00;
  LoopHandle contextLoop;
  shared_ptr<gmlc::networking::AsioContextManager> serv;
  type timerCallback;
  vector<helics::ActionMessage,_std::allocator<helics::ActionMessage>_> dumpMessages;
  anon_class_16_2_af978e1b logDump;
  anon_class_32_4_dda494f4 timerStop;
  ActionMessage dDisable;
  steady_timer ticktimer;
  ActionMessage command;
  activeProtector active;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3f8;
  undefined1 local_3d8 [16];
  __weak_count<(__gnu_cxx::_Lock_policy)2> local_3c8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_3c0;
  size_type local_3b0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_3a8;
  type local_398;
  undefined1 local_388 [32];
  anon_class_16_2_af978e1b local_368;
  anon_class_32_4_dda494f4 local_358;
  _Storage<helics::ActionMessage,_false> local_338;
  char local_280;
  size_t local_278;
  char *pcStack_270;
  size_t local_268;
  char *pcStack_260;
  undefined1 local_258 [184];
  bool local_1a0;
  undefined1 local_190 [64];
  _func_int *local_150 [3];
  undefined1 *local_138;
  _func_int **local_130;
  undefined1 *local_128;
  undefined1 *local_120;
  ActionMessage local_118;
  undefined2 local_60 [4];
  undefined8 local_58;
  undefined8 uStack_50;
  undefined8 local_48;
  undefined8 uStack_40;
  undefined8 local_38;
  
  if (((this->haltOperations)._M_base._M_i & 1U) == 0) {
    local_388._0_8_ = (pointer)0x0;
    local_388._8_8_ = 0;
    local_388._16_8_ = 0;
    local_258._8_8_ = (id *)0x0;
    local_258._16_4_ = local_258._16_4_ & 0xffffff00;
    local_258._0_8_ = local_258 + 0x10;
    gmlc::networking::AsioContextManager::getContextPointer
              ((AsioContextManager *)&local_3a8,(string *)local_258);
    if ((undefined1 *)local_258._0_8_ != local_258 + 0x10) {
      operator_delete((void *)local_258._0_8_,CONCAT44(local_258._20_4_,local_258._16_4_) + 1);
    }
    gmlc::networking::AsioContextManager::startContextLoop((AsioContextManager *)local_3d8);
    owner = *(_func_int **)(local_3a8._M_allocated_capacity + 0x40);
    local_258._0_8_ =
         &::asio::detail::
          typeid_wrapper<asio::detail::deadline_timer_service<asio::detail::chrono_time_traits<std::chrono::_V2::steady_clock,asio::wait_traits<std::chrono::_V2::steady_clock>>>>
          ::typeinfo;
    local_258._8_8_ = (id *)0x0;
    local_190._0_8_ =
         ::asio::detail::service_registry::do_use_service
                   (*(service_registry **)owner,(key *)local_258,
                    ::asio::detail::service_registry::
                    create<asio::detail::deadline_timer_service<asio::detail::chrono_time_traits<std::chrono::_V2::steady_clock,asio::wait_traits<std::chrono::_V2::steady_clock>>>,asio::io_context>
                    ,owner);
    local_190._8_8_ = 0;
    local_190._24_8_ = (wait_op *)0x0;
    local_190._32_8_ = (wait_op *)0x0;
    local_190._40_8_ = 0xffffffffffffffff;
    local_190._48_8_ = (per_timer_data *)0x0;
    local_190._56_8_ = (per_timer_data *)0x0;
    local_130 = local_150;
    local_128 = ::asio::execution::detail::any_executor_base::
                target_fns_table<asio::io_context::basic_executor_type<std::allocator<void>,0ul>>(bool,std::enable_if<!is_same<asio::io_context::basic_executor_type<std::allocator<void>,0ul>,void>::value,void>::type*)
                ::fns_with_execute;
    local_138 = ::asio::execution::detail::any_executor_base::
                object_fns_table<asio::io_context::basic_executor_type<std::allocator<void>,0ul>>(std::enable_if<(!is_same<asio::io_context::basic_executor_type<std::allocator<void>,0ul>,void>::value)&&(!is_same<asio::io_context::basic_executor_type<std::allocator<void>,0ul>,asio::execution::detail::shared_target_executor>::value),void>::type*)
                ::fns;
    local_120 = ::asio::execution::
                any_executor<asio::execution::context_as_t<asio::execution_context&>,asio::execution::detail::blocking::never_t<0>,asio::execution::prefer_only<asio::execution::detail::blocking::possibly_t<0>>,asio::execution::prefer_only<asio::execution::detail::outstanding_work::tracked_t<0>>,asio::execution::prefer_only<asio::execution::detail::outstanding_work::untracked_t<0>>,asio::execution::prefer_only<asio::execution::detail::relationship::fork_t<0>>,asio::execution::prefer_only<asio::execution::detail::relationship::continuation_t<0>>>
                ::prop_fns_table<asio::io_context::basic_executor_type<std::allocator<void>,0ul>>()
                ::fns;
    local_190[0x10] = false;
    local_358.active = (activeProtector *)local_60;
    local_60[0] = 1;
    local_58 = 0;
    uStack_50 = 0;
    local_48 = 0;
    uStack_40 = 0;
    local_38 = 0;
    lVar15 = (this->tickTimer).internalTimeCode;
    local_398.this = this;
    local_398.active = local_358.active;
    local_150[0] = owner;
    if ((0 < lVar15) && (this->disable_timer == false)) {
      if (lVar15 < 500000000) {
        (this->tickTimer).internalTimeCode = 500000000;
      }
      local_258._0_2_ = 0x101;
      gmlc::libguarded::guarded<std::pair<bool,bool>,std::mutex>::operator=
                ((guarded<std::pair<bool,bool>,std::mutex> *)local_60,(pair<bool,_bool> *)local_258)
      ;
      lVar11 = std::chrono::_V2::steady_clock::now();
      lVar15 = (this->tickTimer).internalTimeCode;
      local_258._0_8_ = local_258._0_8_ & 0xffffffff00000000;
      local_258._8_8_ = std::_V2::system_category();
      ::asio::detail::
      deadline_timer_service<asio::detail::chrono_time_traits<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>_>_>
      ::cancel((deadline_timer_service<asio::detail::chrono_time_traits<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>_>_>
                *)local_190._0_8_,(implementation_type *)(local_190 + 8),(error_code *)local_258);
      local_190._8_8_ = lVar15 + lVar11;
      ::asio::
      basic_waitable_timer<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>,_asio::any_io_executor>
      ::
      async_wait<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_GMLC_TDC[P]HELICS_src_helics_core_BrokerBase_cpp:884:26)_&>
                ((basic_waitable_timer<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>,_asio::any_io_executor>
                  *)local_190,&local_398);
    }
    local_358.ticktimer = (steady_timer *)local_190;
    local_358.this = this;
    local_358.contextLoop = (LoopHandle *)local_3d8;
    local_388._24_8_ = std::chrono::_V2::steady_clock::now();
    (this->global_broker_id_local).gid = (this->global_id)._M_i.gid;
    local_368.dumpMessages =
         (vector<helics::ActionMessage,_std::allocator<helics::ActionMessage>_> *)local_388;
    local_368.this = this;
    if (((this->haltOperations)._M_base._M_i & 1U) == 0) {
      this_00 = &this->actionQueue;
      iVar9 = 0;
      do {
        gmlc::containers::
        BlockingPriorityQueue<helics::ActionMessage,_std::mutex,_std::condition_variable>::pop
                  (&local_118,this_00);
        LOCK();
        (this->messageCounter).super___atomic_base<unsigned_long>._M_i =
             (this->messageCounter).super___atomic_base<unsigned_long>._M_i + 1;
        UNLOCK();
        if (this->dumplog == true) {
          std::vector<helics::ActionMessage,_std::allocator<helics::ActionMessage>_>::push_back
                    ((vector<helics::ActionMessage,_std::allocator<helics::ActionMessage>_> *)
                     local_388,&local_118);
        }
        bVar18 = false;
        if (local_118.messageAction != cmd_ignore) {
          aVar7 = commandProcessor(this,&local_118);
          uVar17 = local_3d8._0_8_;
          bVar18 = false;
          if (aVar7 < cmd_terminate_immediately) {
            if (aVar7 == cmd_ignore) {
              iVar9 = iVar9 + 1;
              bVar18 = false;
            }
            else if (aVar7 == cmd_tick) {
              if (((byte)local_118.flags & 0x10) != 0) {
                local_3d8._0_8_ =
                     (__uniq_ptr_impl<gmlc::networking::AsioContextManager::Servicer,_std::default_delete<gmlc::networking::AsioContextManager::Servicer>_>
                      )0x0;
                if ((Servicer *)uVar17 != (Servicer *)0x0) {
                  gmlc::networking::AsioContextManager::Servicer::~Servicer((Servicer *)uVar17);
                  operator_delete((void *)uVar17,0x10);
                }
                gmlc::networking::AsioContextManager::startContextLoop
                          ((AsioContextManager *)local_258);
                uVar6 = local_258._0_8_;
                uVar17 = local_3d8._0_8_;
                local_258._0_8_ = (Servicer *)0x0;
                local_3d8._0_8_ = uVar6;
                if ((_Tuple_impl<0UL,_gmlc::networking::AsioContextManager::Servicer_*,_std::default_delete<gmlc::networking::AsioContextManager::Servicer>_>
                     )uVar17 != (Servicer *)0x0) {
                  gmlc::networking::AsioContextManager::Servicer::~Servicer((Servicer *)uVar17);
                  operator_delete((void *)uVar17,0x10);
                }
                std::
                unique_ptr<gmlc::networking::AsioContextManager::Servicer,_std::default_delete<gmlc::networking::AsioContextManager::Servicer>_>
                ::~unique_ptr((unique_ptr<gmlc::networking::AsioContextManager::Servicer,_std::default_delete<gmlc::networking::AsioContextManager::Servicer>_>
                               *)local_258);
              }
              if ((this->brokerState)._M_i == CONNECTED_ERROR) {
                lVar12 = std::chrono::_V2::steady_clock::now();
                lVar15 = (this->errorDelay).internalTimeCode;
                sVar5 = (this->errorTimeStart).__d.__r;
                lVar12 = lVar12 - sVar5;
                lVar11 = lVar15 / 1000000;
                aVar7 = cmd_user_disconnect;
                if ((SBORROW8(lVar12,lVar11 * 1000000) == lVar12 + lVar11 * -1000000 < 0) ||
                   (aVar7 = cmd_error_check, this->disable_timer != false)) {
                  ActionMessage::setAction(&local_118,aVar7);
                  addActionMessage(this,&local_118);
                }
                else {
                  local_258._0_8_ = local_258._0_8_ & 0xffffffff00000000;
                  local_3b0 = sVar5;
                  local_258._8_8_ = std::_V2::system_category();
                  ::asio::detail::
                  deadline_timer_service<asio::detail::chrono_time_traits<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>_>_>
                  ::cancel((deadline_timer_service<asio::detail::chrono_time_traits<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>_>_>
                            *)local_190._0_8_,(implementation_type *)(local_190 + 8),
                           (error_code *)local_258);
                  local_190._8_8_ = local_3b0 + lVar15;
                  local_258._0_2_ = 0x101;
                  gmlc::libguarded::guarded<std::pair<bool,bool>,std::mutex>::operator=
                            ((guarded<std::pair<bool,bool>,std::mutex> *)local_60,
                             (pair<bool,_bool> *)local_258);
                  ::asio::
                  basic_waitable_timer<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>,_asio::any_io_executor>
                  ::
                  async_wait<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_GMLC_TDC[P]HELICS_src_helics_core_BrokerBase_cpp:884:26)_&>
                            ((basic_waitable_timer<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>,_asio::any_io_executor>
                              *)local_190,&local_398);
                }
              }
              else {
                if (iVar9 == 0) {
                  local_118.messageID = this->forwardingReasons | 1;
                  (*this->_vptr_BrokerBase[5])(this,&local_118);
                }
                else if (this->forwardTick == true) {
                  local_118.messageID = this->forwardingReasons;
                }
                lVar15 = std::chrono::_V2::steady_clock::now();
                uVar16 = (this->maxCoSimDuration).internalTimeCode;
                if (((long)uVar16 < 1) ||
                   (lVar12 = lVar15 - local_388._24_8_, uVar16 = uVar16 / 1000000,
                   lVar11 = uVar16 * 1000000,
                   lVar12 == lVar11 ||
                   SBORROW8(lVar12,lVar11) != (long)(lVar12 + uVar16 * -1000000) < 0)) {
                  lVar11 = (this->tickTimer).internalTimeCode;
                  bVar18 = false;
                  if ((lVar11 < 1) || (this->disable_timer != false)) {
                    iVar9 = 0;
                  }
                  else {
                    local_258._0_8_ = local_258._0_8_ & 0xffffffff00000000;
                    local_258._8_8_ = std::_V2::system_category();
                    ::asio::detail::
                    deadline_timer_service<asio::detail::chrono_time_traits<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>_>_>
                    ::cancel((deadline_timer_service<asio::detail::chrono_time_traits<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>_>_>
                              *)local_190._0_8_,(implementation_type *)(local_190 + 8),
                             (error_code *)local_258);
                    local_190._8_8_ = lVar11 + lVar15;
                    local_258._0_2_ = 0x101;
                    gmlc::libguarded::guarded<std::pair<bool,bool>,std::mutex>::operator=
                              ((guarded<std::pair<bool,bool>,std::mutex> *)local_60,
                               (pair<bool,_bool> *)local_258);
                    ::asio::
                    basic_waitable_timer<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>,_asio::any_io_executor>
                    ::
                    async_wait<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_GMLC_TDC[P]HELICS_src_helics_core_BrokerBase_cpp:884:26)_&>
                              ((basic_waitable_timer<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>,_asio::any_io_executor>
                                *)local_190,&local_398);
                    iVar9 = 0;
                  }
                }
                else {
                  ActionMessage::ActionMessage((ActionMessage *)local_258,cmd_timeout_disconnect);
                  local_258._16_4_ = (this->global_broker_id_local).gid;
                  local_258._8_4_ = local_258._16_4_;
                  addActionMessage(this,(ActionMessage *)local_258);
                  ActionMessage::~ActionMessage((ActionMessage *)local_258);
                  bVar18 = false;
                  iVar9 = 0;
                }
              }
            }
            else if (aVar7 == cmd_stop) {
              queueProcessingLoop::anon_class_32_4_dda494f4::operator()(&local_358);
              if (((this->haltOperations)._M_base._M_i & 1U) == 0) {
                (*this->_vptr_BrokerBase[5])(this,&local_118);
                LOCK();
                (this->mainLoopIsRunning)._M_base._M_i = false;
                UNLOCK();
                queueProcessingLoop::anon_class_16_2_af978e1b::operator()(&local_368);
                (*this->_vptr_BrokerBase[3])(this,0);
              }
              gmlc::containers::
              BlockingPriorityQueue<helics::ActionMessage,_std::mutex,_std::condition_variable>::
              try_pop((optional<helics::ActionMessage> *)local_258,this_00);
              if (local_1a0 == true) {
                do {
                  if ((int)local_258._0_4_ < cmd_remove_filter) {
                    uVar8 = local_258._0_4_ + cmd_disconnect;
                    if ((0x26 < uVar8) ||
                       (((0x600001fe1U >> ((ulong)uVar8 & 0x3f) & 1) == 0 &&
                        (((ulong)uVar8 != 0x26 || (local_258._32_8_ != 0x7fffffffffffffff)))))) {
LAB_002eba6c:
                      if (0x17 < (this->maxLogLevel).super___atomic_base<int>._M_i) {
                        GVar2.gid = (this->global_broker_id_local).gid;
                        pcVar3 = (this->identifier)._M_dataplus._M_p;
                        local_3b0 = (this->identifier)._M_string_length;
                        local_3f8._M_dataplus._M_p = (pointer)&local_3f8.field_2;
                        std::__cxx11::string::_M_construct<char_const*>
                                  ((string *)&local_3f8,"STOPPED unprocessed command ","");
                        prettyPrintString_abi_cxx11_
                                  ((string *)(local_3d8 + 8),(helics *)local_258,command_00);
                        uVar17 = 0xf;
                        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                             *)local_3f8._M_dataplus._M_p != &local_3f8.field_2) {
                          uVar17 = local_3f8.field_2._M_allocated_capacity;
                        }
                        uVar16 = (long)&(local_3c8._M_pi)->_vptr__Sp_counted_base +
                                 local_3f8._M_string_length;
                        if ((ulong)uVar17 < uVar16) {
                          uVar17 = 0xf;
                          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                               *)local_3d8._8_8_ != &local_3c0) {
                            uVar17 = local_3c0._M_allocated_capacity;
                          }
                          if ((ulong)uVar17 < uVar16) goto LAB_002ebafe;
                          pbVar13 = CLI::std::__cxx11::
                                    basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                    ::replace((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                               *)(local_3d8 + 8),0,0,local_3f8._M_dataplus._M_p,
                                              local_3f8._M_string_length);
                        }
                        else {
LAB_002ebafe:
                          pbVar13 = CLI::std::__cxx11::
                                    basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                    ::_M_append(&local_3f8,(char *)local_3d8._8_8_,
                                                (size_type)local_3c8._M_pi);
                        }
                        local_338._0_8_ = (long)&local_338 + 0x10;
                        pcVar4 = (pbVar13->_M_dataplus)._M_p;
                        paVar1 = &pbVar13->field_2;
                        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                             *)pcVar4 == paVar1) {
                          local_338._16_8_ = paVar1->_M_allocated_capacity;
                          local_338._24_8_ = *(undefined8 *)((long)&pbVar13->field_2 + 8);
                        }
                        else {
                          local_338._16_8_ = paVar1->_M_allocated_capacity;
                          local_338._0_8_ = pcVar4;
                        }
                        local_338._8_8_ = pbVar13->_M_string_length;
                        (pbVar13->_M_dataplus)._M_p = (pointer)paVar1;
                        pbVar13->_M_string_length = 0;
                        paVar1->_M_local_buf[0] = '\0';
                        pcStack_270 = (char *)local_338._0_8_;
                        message._M_str = (char *)local_338._0_8_;
                        message._M_len = local_338._8_8_;
                        name._M_str = pcVar3;
                        name._M_len = local_3b0;
                        local_278 = local_338._8_8_;
                        sendToLogger(this,GVar2,0x18,name,message,false);
                        if ((char *)local_338._0_8_ != (char *)((long)&local_338 + 0x10)) {
                          operator_delete((void *)local_338._0_8_,local_338._16_8_ + 1);
                        }
                        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                             *)local_3d8._8_8_ != &local_3c0) {
                          operator_delete((void *)local_3d8._8_8_,
                                          local_3c0._M_allocated_capacity + 1);
                        }
                        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                             *)local_3f8._M_dataplus._M_p != &local_3f8.field_2) {
                          operator_delete(local_3f8._M_dataplus._M_p,
                                          local_3f8.field_2._M_allocated_capacity + 1);
                        }
                      }
                    }
                  }
                  else if ((((3 < (uint)(local_258._0_4_ + 0xfffffc12)) ||
                            (local_258._0_4_ + 0xfffffc12 == 1)) &&
                           (local_258._0_4_ != cmd_remove_filter)) &&
                          (local_258._0_4_ != cmd_remove_endpoint)) goto LAB_002eba6c;
                  gmlc::containers::
                  BlockingPriorityQueue<helics::ActionMessage,_std::mutex,_std::condition_variable>
                  ::try_pop((optional<helics::ActionMessage> *)&local_338._M_value,this_00);
                  std::_Optional_payload_base<helics::ActionMessage>::_M_move_assign
                            ((_Optional_payload_base<helics::ActionMessage> *)local_258,
                             (_Optional_payload_base<helics::ActionMessage> *)&local_338._M_value);
                  if (local_280 == '\x01') {
                    local_280 = '\0';
                    ActionMessage::~ActionMessage(&local_338._M_value);
                  }
                } while (local_1a0 != false);
              }
              goto LAB_002ebf8f;
            }
          }
          else if (aVar7 < cmd_ping) {
            if (aVar7 == cmd_terminate_immediately) {
              queueProcessingLoop::anon_class_32_4_dda494f4::operator()(&local_358);
              LOCK();
              (this->mainLoopIsRunning)._M_base._M_i = false;
              UNLOCK();
              queueProcessingLoop::anon_class_16_2_af978e1b::operator()(&local_368);
              gmlc::containers::
              BlockingPriorityQueue<helics::ActionMessage,_std::mutex,_std::condition_variable>::
              try_pop((optional<helics::ActionMessage> *)local_258,this_00);
              if (local_1a0 == true) {
                do {
                  if ((int)local_258._0_4_ < cmd_remove_filter) {
                    uVar8 = local_258._0_4_ + cmd_disconnect;
                    if ((0x26 < uVar8) ||
                       (((0x600001fe1U >> ((ulong)uVar8 & 0x3f) & 1) == 0 &&
                        (((ulong)uVar8 != 0x26 || (local_258._32_8_ != 0x7fffffffffffffff)))))) {
LAB_002ebd9e:
                      if (0x17 < (this->maxLogLevel).super___atomic_base<int>._M_i) {
                        GVar2.gid = (this->global_broker_id_local).gid;
                        pcVar3 = (this->identifier)._M_dataplus._M_p;
                        local_3b0 = (this->identifier)._M_string_length;
                        local_3f8._M_dataplus._M_p = (pointer)&local_3f8.field_2;
                        std::__cxx11::string::_M_construct<char_const*>
                                  ((string *)&local_3f8,"TI unprocessed command ","");
                        prettyPrintString_abi_cxx11_
                                  ((string *)(local_3d8 + 8),(helics *)local_258,command_01);
                        uVar17 = 0xf;
                        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                             *)local_3f8._M_dataplus._M_p != &local_3f8.field_2) {
                          uVar17 = local_3f8.field_2._M_allocated_capacity;
                        }
                        uVar16 = (long)&(local_3c8._M_pi)->_vptr__Sp_counted_base +
                                 local_3f8._M_string_length;
                        if ((ulong)uVar17 < uVar16) {
                          uVar17 = 0xf;
                          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                               *)local_3d8._8_8_ != &local_3c0) {
                            uVar17 = local_3c0._M_allocated_capacity;
                          }
                          if ((ulong)uVar17 < uVar16) goto LAB_002ebe30;
                          pbVar13 = CLI::std::__cxx11::
                                    basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                    ::replace((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                               *)(local_3d8 + 8),0,0,local_3f8._M_dataplus._M_p,
                                              local_3f8._M_string_length);
                        }
                        else {
LAB_002ebe30:
                          pbVar13 = CLI::std::__cxx11::
                                    basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                    ::_M_append(&local_3f8,(char *)local_3d8._8_8_,
                                                (size_type)local_3c8._M_pi);
                        }
                        local_338._0_8_ = (long)&local_338 + 0x10;
                        pcVar4 = (pbVar13->_M_dataplus)._M_p;
                        paVar1 = &pbVar13->field_2;
                        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                             *)pcVar4 == paVar1) {
                          local_338._16_8_ = paVar1->_M_allocated_capacity;
                          local_338._24_8_ = *(undefined8 *)((long)&pbVar13->field_2 + 8);
                        }
                        else {
                          local_338._16_8_ = paVar1->_M_allocated_capacity;
                          local_338._0_8_ = pcVar4;
                        }
                        local_338._8_8_ = pbVar13->_M_string_length;
                        (pbVar13->_M_dataplus)._M_p = (pointer)paVar1;
                        pbVar13->_M_string_length = 0;
                        paVar1->_M_local_buf[0] = '\0';
                        pcStack_260 = (char *)local_338._0_8_;
                        message_00._M_str = (char *)local_338._0_8_;
                        message_00._M_len = local_338._8_8_;
                        name_00._M_str = pcVar3;
                        name_00._M_len = local_3b0;
                        local_268 = local_338._8_8_;
                        sendToLogger(this,GVar2,0x18,name_00,message_00,false);
                        if ((char *)local_338._0_8_ != (char *)((long)&local_338 + 0x10)) {
                          operator_delete((void *)local_338._0_8_,local_338._16_8_ + 1);
                        }
                        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                             *)local_3d8._8_8_ != &local_3c0) {
                          operator_delete((void *)local_3d8._8_8_,
                                          local_3c0._M_allocated_capacity + 1);
                        }
                        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                             *)local_3f8._M_dataplus._M_p != &local_3f8.field_2) {
                          operator_delete(local_3f8._M_dataplus._M_p,
                                          local_3f8.field_2._M_allocated_capacity + 1);
                        }
                      }
                    }
                  }
                  else if ((((3 < (uint)(local_258._0_4_ + 0xfffffc12)) ||
                            (local_258._0_4_ + 0xfffffc12 == 1)) &&
                           (local_258._0_4_ != cmd_remove_filter)) &&
                          (local_258._0_4_ != cmd_remove_endpoint)) goto LAB_002ebd9e;
                  gmlc::containers::
                  BlockingPriorityQueue<helics::ActionMessage,_std::mutex,_std::condition_variable>
                  ::try_pop((optional<helics::ActionMessage> *)&local_338._M_value,this_00);
                  std::_Optional_payload_base<helics::ActionMessage>::_M_move_assign
                            ((_Optional_payload_base<helics::ActionMessage> *)local_258,
                             (_Optional_payload_base<helics::ActionMessage> *)&local_338._M_value);
                  if (local_280 == '\x01') {
                    local_280 = '\0';
                    ActionMessage::~ActionMessage(&local_338._M_value);
                  }
                } while (local_1a0 != false);
              }
LAB_002ebf8f:
              bVar18 = true;
            }
            else if ((aVar7 == cmd_base_configure) &&
                    (local_118.messageAction == cmd_base_configure)) {
              if (local_118.messageID == 0x58) {
                LOCK();
                (((this->mLogManager).
                  super___shared_ptr<helics::LogManager,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                forceLoggingFlush)._M_base._M_i = (__int_type)((byte)local_118.flags >> 5 & 1);
                UNLOCK();
              }
              else if (local_118.messageID == 0x59) {
                this->dumplog = (bool)((byte)local_118.flags >> 5 & 1);
              }
            }
          }
          else if (aVar7 == cmd_ping) {
            iVar9 = (iVar9 + 1) - (uint)(local_118.source_id.gid == 0);
            (*this->_vptr_BrokerBase[5])(this,&local_118);
          }
          else if ((aVar7 == cmd_error_check) && ((this->brokerState)._M_i == CONNECTED_ERROR)) {
            lVar11 = std::chrono::_V2::steady_clock::now();
            lVar11 = lVar11 - (this->errorTimeStart).__d.__r;
            lVar15 = (this->errorDelay).internalTimeCode / 1000000;
            lVar12 = lVar15 * 1000000;
            if (lVar11 == lVar12 || SBORROW8(lVar11,lVar12) != lVar11 + lVar15 * -1000000 < 0) {
              lVar15 = (this->tickTimer).internalTimeCode;
              if ((lVar15 == lVar11 * 2 || SBORROW8(lVar15,lVar11 * 2) != lVar15 + lVar11 * -2 < 0)
                 && (this->disable_timer != true)) goto LAB_002ec32a;
              local_258._0_8_ = (Servicer *)0x0;
              local_258._8_8_ = (id *)0xbebc200;
              do {
                iVar10 = nanosleep((timespec *)local_258,(timespec *)local_258);
                if (iVar10 != -1) break;
                piVar14 = __errno_location();
              } while (*piVar14 == 4);
            }
            else {
              ActionMessage::setAction(&local_118,cmd_user_disconnect);
            }
            addActionMessage(this,&local_118);
          }
        }
LAB_002ec32a:
        ActionMessage::~ActionMessage(&local_118);
      } while (!bVar18);
    }
    else {
      queueProcessingLoop::anon_class_32_4_dda494f4::operator()(&local_358);
      LOCK();
      (this->mainLoopIsRunning)._M_base._M_i = false;
      UNLOCK();
    }
    ::asio::detail::
    io_object_impl<asio::detail::deadline_timer_service<asio::detail::chrono_time_traits<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>_>_>,_asio::any_io_executor>
    ::~io_object_impl((io_object_impl<asio::detail::deadline_timer_service<asio::detail::chrono_time_traits<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>_>_>,_asio::any_io_executor>
                       *)local_190);
    std::
    unique_ptr<gmlc::networking::AsioContextManager::Servicer,_std::default_delete<gmlc::networking::AsioContextManager::Servicer>_>
    ::~unique_ptr((unique_ptr<gmlc::networking::AsioContextManager::Servicer,_std::default_delete<gmlc::networking::AsioContextManager::Servicer>_>
                   *)local_3d8);
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_3a8._8_8_ !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      CLI::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_3a8._8_8_);
    }
    std::vector<helics::ActionMessage,_std::allocator<helics::ActionMessage>_>::~vector
              ((vector<helics::ActionMessage,_std::allocator<helics::ActionMessage>_> *)local_388);
  }
  else {
    LOCK();
    (this->mainLoopIsRunning)._M_base._M_i = false;
    UNLOCK();
  }
  return;
}

Assistant:

void BrokerBase::queueProcessingLoop()
{
    if (haltOperations) {
        mainLoopIsRunning.store(false);
        return;
    }
    std::vector<ActionMessage> dumpMessages;
#ifndef HELICS_DISABLE_ASIO
    auto serv = gmlc::networking::AsioContextManager::getContextPointer();
    auto contextLoop = serv->startContextLoop();
    asio::steady_timer ticktimer(serv->getBaseContext());
    activeProtector active(true, false);

    auto timerCallback = [this, &active](const std::error_code& errorCode) {
        timerTickHandler(this, active, errorCode);
    };
    if (tickTimer > timeZero && !disable_timer) {
        if (tickTimer < Time(0.5)) {
            tickTimer = Time(0.5);
        }
        active = std::make_pair(true, true);
        ticktimer.expires_at(std::chrono::steady_clock::now() + tickTimer.to_ns());
        ticktimer.async_wait(timerCallback);
    }
    auto timerStop = [&, this]() {
        if (!haltTimer(active, ticktimer)) {
            sendToLogger(global_broker_id_local,
                         LogLevels::WARNING,
                         identifier,
                         "timer unable to cancel properly");
        }
        contextLoop = nullptr;
    };
    auto timeStart = std::chrono::steady_clock::now();
#else
    auto timerStop = []() {};
#endif

    global_broker_id_local = global_id.load();
    int messagesSinceLastTick = 0;
    auto logDump = [&, this]() {
        if (!dumpMessages.empty()) {
            for (auto& act : dumpMessages) {
                mLogManager->sendToLogger(HELICS_LOG_LEVEL_DUMPLOG,
                                          identifier,
                                          fmt::format("|| dl cmd:{} from {} to {}",
                                                      prettyPrintString(act),
                                                      act.source_id.baseValue(),
                                                      act.dest_id.baseValue()));
            }
        }
    };
    if (haltOperations) {
        timerStop();
        mainLoopIsRunning.store(false);
        return;
    }
    while (true) {
        auto command = actionQueue.pop();
        ++messageCounter;
        if (dumplog) {
            dumpMessages.push_back(command);
        }
        if (command.action() == CMD_IGNORE) {
            continue;
        }
        auto ret = commandProcessor(command);
        if (ret == CMD_IGNORE) {
            ++messagesSinceLastTick;
            continue;
        }
        switch (ret) {
            case CMD_TICK:
                if (checkActionFlag(command, error_flag)) {
#ifndef HELICS_DISABLE_ASIO
                    contextLoop = nullptr;
                    contextLoop = serv->startContextLoop();
#endif
                }
                // deal with error state timeout
                if (brokerState.load() == BrokerState::CONNECTED_ERROR) {
                    auto ctime = std::chrono::steady_clock::now();
                    auto timeDiff = ctime - errorTimeStart;
                    if (timeDiff >= errorDelay.to_ms()) {
                        command.setAction(CMD_USER_DISCONNECT);
                        addActionMessage(command);
                    } else {
#ifndef HELICS_DISABLE_ASIO
                        if (!disable_timer) {
                            ticktimer.expires_at(errorTimeStart + errorDelay.to_ns());
                            active = std::make_pair(true, true);
                            ticktimer.async_wait(timerCallback);
                        } else {
                            command.setAction(CMD_ERROR_CHECK);
                            addActionMessage(command);
                        }
#else
                        command.setAction(CMD_ERROR_CHECK);
                        addActionMessage(command);
#endif
                    }
                    break;
                }
#ifndef DISABLE_TICK
                if (messagesSinceLastTick == 0) {
                    command.messageID =
                        forwardingReasons | static_cast<uint32_t>(TickForwardingReasons::NO_COMMS);
                    processCommand(std::move(command));
                } else if (forwardTick) {
                    command.messageID = forwardingReasons;
                }
#endif
                messagesSinceLastTick = 0;
// reschedule the timer
#ifndef HELICS_DISABLE_ASIO
                {
                    auto currTime = std::chrono::steady_clock::now();
                    if (maxCoSimDuration > timeZero) {
                        if ((currTime - timeStart) > maxCoSimDuration.to_ms()) {
                            ActionMessage dDisable(CMD_TIMEOUT_DISCONNECT);
                            dDisable.source_id = global_broker_id_local;
                            dDisable.dest_id = global_broker_id_local;
                            addActionMessage(dDisable);
                            break;
                        }
                    }
                    if (tickTimer > timeZero && !disable_timer) {
                        ticktimer.expires_at(currTime + tickTimer.to_ns());
                        active = std::make_pair(true, true);
                        ticktimer.async_wait(timerCallback);
                    }
                }
#endif
                break;
            case CMD_ERROR_CHECK:
                if (brokerState.load() == BrokerState::CONNECTED_ERROR) {
                    auto ctime = std::chrono::steady_clock::now();
                    auto timeDiff = ctime - errorTimeStart;
                    if (timeDiff > errorDelay.to_ms()) {
                        command.setAction(CMD_USER_DISCONNECT);
                        addActionMessage(command);
                    } else {
#ifndef HELICS_DISABLE_ASIO
                        if (tickTimer > timeDiff * 2 || disable_timer) {
                            std::this_thread::sleep_for(std::chrono::milliseconds(200));
                            addActionMessage(command);
                        }
#else
                        std::this_thread::sleep_for(std::chrono::milliseconds(200));
                        addActionMessage(command);
#endif
                    }
                }
                break;
            case CMD_PING:
                // ping is processed normally but doesn't count as an actual message for timeout
                // purposes unless it comes from the parent
                if (command.source_id != parent_broker_id) {
                    ++messagesSinceLastTick;
                }
                processCommand(std::move(command));
                break;
            case CMD_BASE_CONFIGURE:
                baseConfigure(command);
                break;
            case CMD_IGNORE:
            default:
                break;
            case CMD_TERMINATE_IMMEDIATELY:
                timerStop();
                mainLoopIsRunning.store(false);
                logDump();
                {
                    auto tcmd = actionQueue.try_pop();
                    while (tcmd) {
                        if (!isDisconnectCommand(*tcmd)) {
                            LOG_TRACE(global_broker_id_local,
                                      identifier,
                                      std::string("TI unprocessed command ") +
                                          prettyPrintString(*tcmd));
                        }
                        tcmd = actionQueue.try_pop();
                    }
                }
                return;  // immediate return
            case CMD_STOP:
                timerStop();
                if (!haltOperations) {
                    processCommand(std::move(command));
                    mainLoopIsRunning.store(false);
                    logDump();
                    processDisconnect();
                }
                auto tcmd = actionQueue.try_pop();
                while (tcmd) {
                    if (!isDisconnectCommand(*tcmd)) {
                        LOG_TRACE(global_broker_id_local,
                                  identifier,
                                  std::string("STOPPED unprocessed command ") +
                                      prettyPrintString(*tcmd));
                    }
                    tcmd = actionQueue.try_pop();
                }
                return;
        }
    }
}